

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeStructRMW<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,AtomicRMWOp op)

{
  __index_type *__return_storage_ptr___00;
  MemoryOrder MVar1;
  MemoryOrder *pMVar2;
  Err *pEVar3;
  bool bVar4;
  Err local_278;
  Err *local_258;
  Err *err_3;
  Result<wasm::Ok> _val_3;
  undefined1 local_220 [8];
  Result<wasm::Ok> field;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  Result<wasm::Ok> type;
  string local_178;
  Err local_158;
  Err local_138;
  Err *local_118;
  Err *err_1;
  Result<wasm::MemoryOrder> _val_1;
  Result<wasm::MemoryOrder> order2;
  Err local_b8;
  Err *local_98;
  Err *err;
  undefined1 local_80 [8];
  Result<wasm::MemoryOrder> _val;
  Result<wasm::MemoryOrder> order1;
  AtomicRMWOp op_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDeclsCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
               super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
               super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
               super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
               super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20);
  memorder<wasm::WATParser::ParseDeclsCtx>
            ((Result<wasm::MemoryOrder> *)__return_storage_ptr___00,ctx);
  Result<wasm::MemoryOrder>::Result
            ((Result<wasm::MemoryOrder> *)local_80,
             (Result<wasm::MemoryOrder> *)__return_storage_ptr___00);
  local_98 = Result<wasm::MemoryOrder>::getErr((Result<wasm::MemoryOrder> *)local_80);
  bVar4 = local_98 == (Err *)0x0;
  if (!bVar4) {
    wasm::Err::Err(&local_b8,local_98);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b8);
    wasm::Err::~Err(&local_b8);
  }
  Result<wasm::MemoryOrder>::~Result((Result<wasm::MemoryOrder> *)local_80);
  if (bVar4) {
    memorder<wasm::WATParser::ParseDeclsCtx>
              ((Result<wasm::MemoryOrder> *)
               ((long)&_val_1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20),ctx);
    Result<wasm::MemoryOrder>::Result
              ((Result<wasm::MemoryOrder> *)&err_1,
               (Result<wasm::MemoryOrder> *)
               ((long)&_val_1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
    local_118 = Result<wasm::MemoryOrder>::getErr((Result<wasm::MemoryOrder> *)&err_1);
    bVar4 = local_118 == (Err *)0x0;
    if (!bVar4) {
      wasm::Err::Err(&local_138,local_118);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_138);
      wasm::Err::~Err(&local_138);
    }
    Result<wasm::MemoryOrder>::~Result((Result<wasm::MemoryOrder> *)&err_1);
    if (bVar4) {
      pMVar2 = Result<wasm::MemoryOrder>::operator*
                         ((Result<wasm::MemoryOrder> *)
                          ((long)&_val.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                  super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
      MVar1 = *pMVar2;
      pMVar2 = Result<wasm::MemoryOrder>::operator*
                         ((Result<wasm::MemoryOrder> *)
                          ((long)&_val_1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                  super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
      if (MVar1 == *pMVar2) {
        typeidx<wasm::WATParser::ParseDeclsCtx>
                  ((Result<wasm::Ok> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx);
        Result<wasm::Ok>::Result
                  ((Result<wasm::Ok> *)&err_2,
                   (Result<wasm::Ok> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        pEVar3 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
        if (pEVar3 != (Err *)0x0) {
          wasm::Err::Err((Err *)((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar3);
          Result<wasm::Ok>::Result
                    (__return_storage_ptr__,
                     (Err *)((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          wasm::Err::~Err((Err *)((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        }
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
        if (pEVar3 == (Err *)0x0) {
          Result<wasm::Ok>::operator*
                    ((Result<wasm::Ok> *)
                     ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          fieldidx<wasm::WATParser::ParseDeclsCtx>(local_220,ctx);
          Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err_3,(Result<wasm::Ok> *)local_220);
          local_258 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_3);
          bVar4 = local_258 == (Err *)0x0;
          if (!bVar4) {
            wasm::Err::Err(&local_278,local_258);
            Result<wasm::Ok>::Result(__return_storage_ptr__,&local_278);
            wasm::Err::~Err(&local_278);
          }
          Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_3);
          if (bVar4) {
            Result<wasm::Ok>::operator*
                      ((Result<wasm::Ok> *)
                       ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            Result<wasm::Ok>::operator*((Result<wasm::Ok> *)local_220);
            pMVar2 = Result<wasm::MemoryOrder>::operator*
                               ((Result<wasm::MemoryOrder> *)
                                ((long)&_val.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                        super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20)
                               );
            NullInstrParserCtx::makeStructRMW<wasm::Ok>
                      (__return_storage_ptr__,(NullInstrParserCtx *)ctx,pos,annotations,op,*pMVar2);
          }
          Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_220);
        }
        Result<wasm::Ok>::~Result
                  ((Result<wasm::Ok> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_178,"struct.atomic.rmw memory orders must be identical",
                   (allocator<char> *)
                   ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
        Lexer::err(&local_158,&ctx->in,(ulong)pos,&local_178);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_158);
        wasm::Err::~Err(&local_158);
        std::__cxx11::string::~string((string *)&local_178);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
      }
    }
    Result<wasm::MemoryOrder>::~Result
              ((Result<wasm::MemoryOrder> *)
               ((long)&_val_1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
  }
  Result<wasm::MemoryOrder>::~Result
            ((Result<wasm::MemoryOrder> *)
             ((long)&_val.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                     super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                     super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                     super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> makeStructRMW(Ctx& ctx,
                       Index pos,
                       const std::vector<Annotation>& annotations,
                       AtomicRMWOp op) {
  auto order1 = memorder(ctx);
  CHECK_ERR(order1);
  auto order2 = memorder(ctx);
  CHECK_ERR(order2);
  if (*order1 != *order2) {
    return ctx.in.err(pos, "struct.atomic.rmw memory orders must be identical");
  }
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  auto field = fieldidx(ctx, *type);
  CHECK_ERR(field);
  return ctx.makeStructRMW(pos, annotations, op, *type, *field, *order1);
}